

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yssimplesound.cpp
# Opt level: O0

YSRESULT __thiscall YsSoundPlayer::SoundData::LoadWav(SoundData *this,char *fn)

{
  FILE *__stream;
  YSRESULT res;
  FILE *fp;
  char *fn_local;
  SoundData *this_local;
  
  printf("Loading %s\n",fn);
  __stream = fopen(fn,"rb");
  if (__stream == (FILE *)0x0) {
    this_local._4_4_ = YSERR;
  }
  else {
    this_local._4_4_ = LoadWav(this,(FILE *)__stream);
    fclose(__stream);
  }
  return this_local._4_4_;
}

Assistant:

YSRESULT YsSoundPlayer::SoundData::LoadWav(const char fn[])
{
	FILE *fp;
	printf("Loading %s\n",fn);
	fp=fopen(fn,"rb");
	if(fp!=NULL)
	{
		auto res=LoadWav(fp);
		fclose(fp);
		return res;
	}
	return YSERR;
}